

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.h
# Opt level: O0

int run_container_index_equalorlarger(run_container_t *arr,uint16_t x)

{
  int iVar1;
  uint16_t in_SI;
  int *in_RDI;
  int32_t le;
  int32_t offset;
  int32_t index;
  int32_t local_4;
  
  local_4 = interleavedBinarySearch(*(rle16_t **)(in_RDI + 2),*in_RDI,in_SI);
  if (local_4 < 0) {
    iVar1 = -local_4;
    local_4 = iVar1 + -2;
    if (((local_4 == -1) ||
        ((int)(uint)*(ushort *)(*(long *)(in_RDI + 2) + 2 + (long)local_4 * 4) <
         (int)((uint)in_SI - (uint)*(ushort *)(*(long *)(in_RDI + 2) + (long)local_4 * 4)))) &&
       (local_4 = iVar1 + -1, *in_RDI <= local_4)) {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

inline int run_container_index_equalorlarger(const run_container_t *arr,
                                             uint16_t x) {
    int32_t index = interleavedBinarySearch(arr->runs, arr->n_runs, x);
    if (index >= 0) return index;
    index = -index - 2;  // points to preceding run, possibly -1
    if (index != -1) {   // possible match
        int32_t offset = x - arr->runs[index].value;
        int32_t le = arr->runs[index].length;
        if (offset <= le) return index;
    }
    index += 1;
    if (index < arr->n_runs) {
        return index;
    }
    return -1;
}